

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

void Abc_NamPrint(Abc_Nam_t *p,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  uint i;
  
  __stream = _stdout;
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"wb");
  }
  if (__stream == (FILE *)0x0) {
    printf("Count node open file %s\n",pFileName);
    return;
  }
  for (i = 1; (int)i < (p->vInt2Handle).nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(&p->vInt2Handle,i);
    fprintf(__stream,"%8d = %s\n",(ulong)i,p->pStore + iVar1);
  }
  if (__stream == _stdout) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_NamPrint( Abc_Nam_t * p, char * pFileName )
{
    FILE * pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    int h, i;
    if ( pFile == NULL ) { printf( "Count node open file %s\n", pFileName ); return; }
    Vec_IntForEachEntryStart( &p->vInt2Handle, h, i, 1 )
        fprintf( pFile, "%8d = %s\n", i, Abc_NamHandleToStr(p, h) );
    if ( pFile != stdout )
        fclose(pFile);
}